

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall
soul::AST::QualifiedIdentifier::addToPath
          (QualifiedIdentifier *this,IdentifierPath *path,
          pool_ptr<soul::AST::Expression> *specialisationArgs)

{
  PathSection PStack_78;
  
  ArrayWithPreallocation<soul::Identifier,_8UL>::ArrayWithPreallocation
            ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&PStack_78,&path->pathSections);
  PStack_78.specialisationArgs = (pool_ptr<soul::AST::Expression>)specialisationArgs->object;
  std::
  vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
  ::emplace_back<soul::AST::QualifiedIdentifier::PathSection>(&this->pathSections,&PStack_78);
  ArrayWithPreallocation<soul::Identifier,_8UL>::clear
            ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&PStack_78);
  return;
}

Assistant:

void addToPath (IdentifierPath path, pool_ptr<Expression> specialisationArgs)
        {
            pathSections.push_back ({ path, specialisationArgs });
        }